

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O3

void uv__udp_sendmsg(uv_udp_t *handle)

{
  void **ppvVar1;
  short sVar2;
  undefined8 *puVar3;
  int iVar4;
  int *piVar5;
  long lVar6;
  long *plVar7;
  uint uVar8;
  uv__mmsghdr *puVar9;
  ulong uVar10;
  undefined4 uVar11;
  ulong uVar12;
  uv__mmsghdr local_538 [20];
  
  uv_once(&once,uv__udp_mmsg_init);
  if (uv__sendmmsg_avail == '\0') {
    plVar7 = (long *)handle->write_queue[0];
    if (handle->write_queue == (void **)plVar7) {
      return;
    }
    do {
      if (plVar7 == (long *)0x0) {
        __assert_fail("q != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/src/unix/udp.c"
                      ,0x1a2,"void uv__udp_sendmsg(uv_udp_t *)");
      }
      local_538[0].msg_hdr.msg_control = (void *)0x0;
      local_538[0].msg_hdr.msg_controllen = 0;
      local_538[0].msg_hdr.msg_iov = (iovec *)0x0;
      local_538[0].msg_hdr.msg_iovlen = 0;
      local_538[0].msg_hdr.msg_name = (long *)0x0;
      local_538[0].msg_hdr._8_8_ = 0;
      local_538[0].msg_hdr.msg_flags = 0;
      local_538[0].msg_hdr._52_4_ = 0;
      sVar2 = (short)plVar7[2];
      if (sVar2 != 0) {
        local_538[0].msg_hdr.msg_name = plVar7 + 2;
        if (sVar2 == 1) {
          uVar8 = 0x6e;
        }
        else {
          uVar8 = 0x1c;
          if (sVar2 != 10) {
            if (sVar2 != 2) {
              __assert_fail("0 && \"unsupported address family\"",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/src/unix/udp.c"
                            ,0x1b4,"void uv__udp_sendmsg(uv_udp_t *)");
            }
            uVar8 = 0x10;
          }
        }
        local_538[0].msg_hdr._12_4_ = 0;
        local_538[0].msg_hdr.msg_namelen = uVar8;
      }
      local_538[0].msg_hdr.msg_iov = (iovec *)plVar7[0x13];
      local_538[0].msg_hdr.msg_iovlen = (size_t)*(uint *)(plVar7 + 0x12);
      do {
        lVar6 = sendmsg((handle->io_watcher).fd,(msghdr *)local_538,0);
        if (lVar6 != -1) goto LAB_001187c0;
        piVar5 = __errno_location();
        iVar4 = *piVar5;
      } while ((long)iVar4 == 4);
      if (iVar4 == 0xb) {
        return;
      }
      if (iVar4 == 0x69) {
        return;
      }
      lVar6 = -(long)iVar4;
LAB_001187c0:
      plVar7[0x14] = lVar6;
      lVar6 = *plVar7;
      *(long *)plVar7[1] = lVar6;
      *(long *)(lVar6 + 8) = plVar7[1];
      *plVar7 = (long)handle->write_completed_queue;
      puVar3 = (undefined8 *)handle->write_completed_queue[1];
      plVar7[1] = (long)puVar3;
      *puVar3 = plVar7;
      handle->write_completed_queue[1] = plVar7;
      uv__io_feed(handle->loop,&handle->io_watcher);
      plVar7 = (long *)handle->write_queue[0];
      if (handle->write_queue == (void **)plVar7) {
        return;
      }
    } while( true );
  }
  ppvVar1 = handle->write_queue;
  plVar7 = (long *)handle->write_queue[0];
  if (ppvVar1 == (void **)plVar7) {
    return;
  }
LAB_001185a2:
  if ((void **)plVar7 == ppvVar1) {
    uVar12 = 0;
  }
  else {
    puVar9 = local_538;
    uVar10 = 0;
    do {
      if (plVar7 == (long *)0x0) {
        __assert_fail("q != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/src/unix/udp.c"
                      ,0x148,"void uv__udp_sendmmsg(uv_udp_t *)");
      }
      *(long *)((long)puVar9 + 0x30) = 0;
      *(long *)((long)puVar9 + 0x38) = 0;
      *(long *)((long)puVar9 + 0x20) = 0;
      *(long *)((long)puVar9 + 0x28) = 0;
      *(long *)((long)puVar9 + 0x10) = 0;
      *(long *)((long)puVar9 + 0x18) = 0;
      *(long *)puVar9 = 0;
      *(long *)((long)puVar9 + 8) = 0;
      sVar2 = (short)plVar7[2];
      if (sVar2 != 0) {
        *(long **)puVar9 = plVar7 + 2;
        if (sVar2 == 1) {
          uVar11 = 0x6e;
        }
        else {
          uVar11 = 0x1c;
          if (sVar2 != 10) {
            if (sVar2 != 2) {
              __assert_fail("0 && \"unsupported address family\"",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/src/unix/udp.c"
                            ,0x15a,"void uv__udp_sendmmsg(uv_udp_t *)");
            }
            uVar11 = 0x10;
          }
        }
        *(undefined4 *)((long)puVar9 + 8) = uVar11;
      }
      *(long *)((long)puVar9 + 0x10) = plVar7[0x13];
      *(ulong *)((long)puVar9 + 0x18) = (ulong)*(uint *)(plVar7 + 0x12);
      uVar12 = uVar10 + 1;
      if (0x12 < uVar10) break;
      plVar7 = (long *)*plVar7;
      puVar9 = (uv__mmsghdr *)((long)puVar9 + 0x40);
      uVar10 = uVar12;
    } while ((void **)plVar7 != ppvVar1);
  }
  do {
    iVar4 = uv__sendmmsg((handle->io_watcher).fd,local_538,(uint)uVar12,0);
    if (iVar4 != -1) break;
    piVar5 = __errno_location();
    iVar4 = *piVar5;
    if (iVar4 != 4) goto LAB_0011881b;
  } while( true );
  if (iVar4 < 1) {
    piVar5 = __errno_location();
    iVar4 = *piVar5;
LAB_0011881b:
    if (iVar4 == 0xb) {
      return;
    }
    if (iVar4 == 0x69) {
      return;
    }
    plVar7 = (long *)*ppvVar1;
    if ((void **)plVar7 != ppvVar1 && uVar12 != 0) {
      uVar10 = 1;
      goto LAB_0011884d;
    }
    goto LAB_00118897;
  }
  plVar7 = (long *)*ppvVar1;
  if ((void **)plVar7 != ppvVar1 && uVar12 != 0) {
    uVar10 = 1;
    do {
      if (plVar7 == (long *)0x0) {
        __assert_fail("q != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/src/unix/udp.c"
                      ,0x17b,"void uv__udp_sendmmsg(uv_udp_t *)");
      }
      plVar7[0x14] = *(long *)(plVar7[0x13] + 8);
      lVar6 = *plVar7;
      *(long *)plVar7[1] = lVar6;
      *(long *)(lVar6 + 8) = plVar7[1];
      *plVar7 = (long)handle->write_completed_queue;
      puVar3 = (undefined8 *)handle->write_completed_queue[1];
      plVar7[1] = (long)puVar3;
      *puVar3 = plVar7;
      handle->write_completed_queue[1] = plVar7;
      plVar7 = (long *)handle->write_queue[0];
    } while ((uVar10 < uVar12) && (uVar10 = uVar10 + 1, (void **)plVar7 != ppvVar1));
  }
  if (ppvVar1 == (void **)plVar7) goto LAB_00118897;
  goto LAB_001185a2;
  while( true ) {
    plVar7 = (long *)*plVar7;
    uVar10 = uVar10 + 1;
    if ((void **)plVar7 == ppvVar1) break;
LAB_0011884d:
    if (plVar7 == (long *)0x0) {
      __assert_fail("q != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/src/unix/udp.c"
                    ,0x16c,"void uv__udp_sendmmsg(uv_udp_t *)");
    }
    plVar7[0x14] = (long)-iVar4;
    lVar6 = *plVar7;
    *(long *)plVar7[1] = lVar6;
    *(long *)(lVar6 + 8) = plVar7[1];
    *plVar7 = (long)handle->write_completed_queue;
    puVar3 = (undefined8 *)handle->write_completed_queue[1];
    plVar7[1] = (long)puVar3;
    *puVar3 = plVar7;
    handle->write_completed_queue[1] = plVar7;
    if (uVar12 <= uVar10) break;
  }
LAB_00118897:
  uv__io_feed(handle->loop,&handle->io_watcher);
  return;
}

Assistant:

static void uv__udp_sendmsg(uv_udp_t* handle) {
  uv_udp_send_t* req;
  struct msghdr h;
  QUEUE* q;
  ssize_t size;

#if HAVE_MMSG
  uv_once(&once, uv__udp_mmsg_init);
  if (uv__sendmmsg_avail) {
    uv__udp_sendmmsg(handle);
    return;
  }
#endif

  while (!QUEUE_EMPTY(&handle->write_queue)) {
    q = QUEUE_HEAD(&handle->write_queue);
    assert(q != NULL);

    req = QUEUE_DATA(q, uv_udp_send_t, queue);
    assert(req != NULL);

    memset(&h, 0, sizeof h);
    if (req->addr.ss_family == AF_UNSPEC) {
      h.msg_name = NULL;
      h.msg_namelen = 0;
    } else {
      h.msg_name = &req->addr;
      if (req->addr.ss_family == AF_INET6)
        h.msg_namelen = sizeof(struct sockaddr_in6);
      else if (req->addr.ss_family == AF_INET)
        h.msg_namelen = sizeof(struct sockaddr_in);
      else if (req->addr.ss_family == AF_UNIX)
        h.msg_namelen = sizeof(struct sockaddr_un);
      else {
        assert(0 && "unsupported address family");
        abort();
      }
    }
    h.msg_iov = (struct iovec*) req->bufs;
    h.msg_iovlen = req->nbufs;

    do {
      size = sendmsg(handle->io_watcher.fd, &h, 0);
    } while (size == -1 && errno == EINTR);

    if (size == -1) {
      if (errno == EAGAIN || errno == EWOULDBLOCK || errno == ENOBUFS)
        break;
    }

    req->status = (size == -1 ? UV__ERR(errno) : size);

    /* Sending a datagram is an atomic operation: either all data
     * is written or nothing is (and EMSGSIZE is raised). That is
     * why we don't handle partial writes. Just pop the request
     * off the write queue and onto the completed queue, done.
     */
    QUEUE_REMOVE(&req->queue);
    QUEUE_INSERT_TAIL(&handle->write_completed_queue, &req->queue);
    uv__io_feed(handle->loop, &handle->io_watcher);
  }
}